

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QList<QRect> *
QMdi::MinOverlapPlacer::findNonInsiders
          (QList<QRect> *__return_storage_ptr__,QRect *domain,QList<QRect> *source)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  QRect __pred;
  char cVar3;
  iterator iVar4;
  iterator __last;
  iterator __seed;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QList<QRect> *result;
  _Temporary_buffer<QList<QRect>::iterator,_QRect> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined1 **)domain;
  puVar2 = *(undefined1 **)&domain->x2;
  __pred = *domain;
  iVar4 = QList<QRect>::begin(source);
  __last = QList<QRect>::end(source);
  lVar5 = (long)__last.i - (long)iVar4.i;
  local_58._M_original_len = (size_type_conflict1)puVar1;
  local_58._M_len = (size_type_conflict1)puVar2;
  if (0 < lVar5 >> 6) {
    lVar6 = (lVar5 >> 6) + 1;
    do {
      cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i,0));
      __seed.i = iVar4.i;
      if (cVar3 == '\0') goto LAB_0043e670;
      cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i + 1,0));
      __seed.i = iVar4.i + 1;
      if (cVar3 == '\0') goto LAB_0043e670;
      cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i + 2,0));
      __seed.i = iVar4.i + 2;
      if (cVar3 == '\0') goto LAB_0043e670;
      cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i + 3,0));
      __seed.i = iVar4.i + 3;
      if (cVar3 == '\0') goto LAB_0043e670;
      iVar4.i = iVar4.i + 4;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -0x40;
    } while (1 < lVar6);
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 == 1) {
LAB_0043e658:
    cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i,0));
    __seed.i = iVar4.i;
    if (cVar3 != '\0') {
      __seed = __last;
    }
  }
  else if (lVar5 == 2) {
LAB_0043e635:
    cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i,0));
    __seed.i = iVar4.i;
    if (cVar3 != '\0') {
      iVar4.i = iVar4.i + 1;
      goto LAB_0043e658;
    }
  }
  else {
    __seed = __last;
    if (lVar5 != 3) goto LAB_0043e6f3;
    cVar3 = QRect::contains((QRect *)&local_58,SUB81(iVar4.i,0));
    __seed.i = iVar4.i;
    if (cVar3 != '\0') {
      iVar4.i = iVar4.i + 1;
      goto LAB_0043e635;
    }
  }
LAB_0043e670:
  if (__seed.i != __last.i) {
    local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    std::_Temporary_buffer<QList<QRect>::iterator,_QRect>::_Temporary_buffer
              (&local_58,__seed,(long)__last.i - (long)__seed.i >> 4);
    __seed = std::
             __stable_partition_adaptive<QList<QRect>::iterator,QRect*,__gnu_cxx::__ops::_Iter_pred<QMdi::MinOverlapPlacer::findNonInsiders(QRect_const&,QList<QRect>&)::__0>,long_long>
                       (__seed,__last,
                        (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmdiarea_cpp:436:13)>
                         )__pred,local_58._M_original_len,local_58._M_buffer,local_58._M_len);
    operator_delete(local_58._M_buffer,local_58._M_len << 4);
  }
LAB_0043e6f3:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QRect *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar4 = QList<QRect>::end(source);
  QList<QRect>::reserve(__return_storage_ptr__,(long)iVar4.i - (long)__seed.i >> 4);
  iVar4 = QList<QRect>::end(source);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<QList<QRect>::iterator,std::back_insert_iterator<QList<QRect>>>
            (__seed,iVar4,(back_insert_iterator<QList<QRect>_>)__return_storage_ptr__);
  iVar4 = QList<QRect>::end(source);
  QList<QRect>::erase(source,(const_iterator)__seed.i,(const_iterator)iVar4.i);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> MinOverlapPlacer::findNonInsiders(const QRect &domain, QList<QRect> &source)
{
    const auto containedInDomain =
            [domain](const QRect &srcRect) { return domain.contains(srcRect); };

    const auto firstOut = std::stable_partition(source.begin(), source.end(), containedInDomain);

    QList<QRect> result;
    result.reserve(source.end() - firstOut);
    std::copy(firstOut, source.end(), std::back_inserter(result));

    source.erase(firstOut, source.end());

    return result;
}